

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O1

void set_artifact_intrinsic(obj *otmp,boolean on,long wp_mask,boolean side_effects)

{
  byte *pbVar1;
  ulong uVar2;
  obj **ppoVar3;
  boolean bVar4;
  uint uVar5;
  uint uVar6;
  artifact *paVar7;
  artifact *paVar8;
  obj *poVar9;
  ulong uVar10;
  uchar uVar11;
  uint uVar12;
  long lVar13;
  prop *ppVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  
  if ((otmp == (obj *)0x0) || ((long)otmp->oartifact == 0)) {
    paVar8 = (artifact *)0x0;
  }
  else {
    paVar8 = artilist + otmp->oartifact;
  }
  if (paVar8 == (artifact *)0x0) {
    uVar11 = '\0';
    if (otmp->oprops == 0) {
      return;
    }
  }
  else {
    uVar11 = (&paVar8->defn)[wp_mask == 0x1000].adtyp;
  }
  bVar16 = true;
  switch(uVar11) {
  case '\x01':
    lVar13 = 0x260;
    goto LAB_0014ad91;
  case '\x02':
    ppVar14 = u.uprops + 1;
    break;
  case '\x03':
    ppVar14 = u.uprops + 2;
    break;
  default:
    bVar16 = false;
    ppVar14 = (prop *)0x0;
    break;
  case '\x05':
    ppVar14 = u.uprops + 4;
    break;
  case '\x06':
    lVar13 = 0x8c;
    goto LAB_0014ad91;
  case '\a':
    lVar13 = 0x98;
LAB_0014ad91:
    ppVar14 = (prop *)(u.urooms + lVar13 + -0x24);
  }
  if ((((on == '\0') && (wp_mask == 0x1000)) && (bVar16)) && (poVar9 = invent, invent != (obj *)0x0)
     ) {
    do {
      if ((poVar9 != otmp) && ((long)poVar9->oartifact != 0)) {
        if ((uVar11 == artilist[poVar9->oartifact].cary.adtyp) ||
           ((uVar11 == '\x01' && (bVar4 = is_quest_artifact(poVar9), bVar4 != '\0')))) {
          bVar16 = false;
          ppVar14 = (prop *)0x0;
        }
        else {
          bVar16 = true;
        }
        if (!bVar16) break;
      }
      ppoVar3 = &poVar9->nobj;
      poVar9 = *ppoVar3;
    } while (*ppoVar3 != (obj *)0x0);
  }
  uVar12 = (uint)wp_mask;
  if (ppVar14 != (prop *)0x0) {
    uVar6 = ~uVar12 & ppVar14->extrinsic;
    if (on != '\0') {
      uVar6 = ppVar14->extrinsic | uVar12;
    }
    ppVar14->extrinsic = uVar6;
  }
  bVar4 = is_quest_artifact(otmp);
  if ((wp_mask == 0x1000) && (bVar4 != '\0')) {
    poVar9 = invent;
    if (on == '\0') {
      for (; poVar9 != (obj *)0x0; poVar9 = poVar9->nobj) {
        if (((poVar9 != otmp) && ((long)poVar9->oartifact != 0)) &&
           (artilist[poVar9->oartifact].cary.adtyp == '\x01')) goto LAB_0014aeaf;
      }
      u.uprops[0x2c].extrinsic = u.uprops[0x2c].extrinsic & 0xffffefff;
    }
    else {
      u.uprops[0x2c].extrinsic = u.uprops[0x2c].extrinsic | 0x1000;
    }
  }
LAB_0014aeaf:
  if (paVar8 == (artifact *)0x0) {
    if ((wp_mask == 0x100) || ((wp_mask == 0x400 && ((on == '\0' || (u.twoweap != '\0')))))) {
      if (otmp->oclass == '\x02') {
        if (2 < (byte)(objects[otmp->otyp].oc_subtyp + 0x18U)) {
LAB_0014af5c:
          if (2 < (byte)(objects[otmp->otyp].oc_subtyp + 0x1bU)) {
            uVar2 = otmp->oprops;
            uVar6 = (uint)uVar2;
            uVar10 = (ulong)((uint)(uVar2 >> 8) & 0x20 |
                            (uint)(uVar2 >> 3) & 0x200 |
                            (uVar6 & 0x10) * 0x400000 + (uVar6 & 0x400) * 4);
            bVar15 = (uVar6 >> 0x13 & 1) == 0;
            bVar16 = (uVar6 >> 0xe & 1) == 0;
            bVar18 = -1 < (short)uVar2;
            bVar17 = (uVar6 >> 0x12 & 1) == 0;
            goto LAB_0014af92;
          }
        }
      }
      else if ((otmp->oclass == '\x06') && (objects[otmp->otyp].oc_subtyp != '\0'))
      goto LAB_0014af5c;
    }
    uVar10 = 0;
  }
  else {
    uVar10 = (&paVar8->spfx)[wp_mask == 0x1000];
  }
  bVar16 = true;
  bVar18 = true;
  bVar17 = true;
  bVar15 = true;
LAB_0014af92:
  if (((on == '\0') && (wp_mask == 0x1000)) && (poVar9 = invent, uVar10 != 0)) {
    for (; poVar9 != (obj *)0x0; poVar9 = poVar9->nobj) {
      if ((poVar9 != otmp) && ((long)poVar9->oartifact != 0)) {
        uVar10 = uVar10 & ~artilist[poVar9->oartifact].cspfx;
      }
    }
  }
  uVar6 = (uint)uVar10;
  if ((uVar6 >> 9 & 1) != 0) {
    uVar5 = u.uprops[0xb].extrinsic | uVar12;
    u.uprops[0xb].extrinsic = ~uVar12 & u.uprops[0xb].extrinsic;
    if (on != '\0') {
      u.uprops[0xb].extrinsic = uVar5;
    }
  }
  if ((uVar6 >> 0xb & 1) != 0) {
    make_hallucinated((ulong)(on == '\0'),side_effects,wp_mask);
  }
  if ((uVar6 >> 0xc & 1) != 0) {
    uVar5 = ~uVar12 & u.uprops[0x19].extrinsic;
    u.uprops[0x19].extrinsic = u.uprops[0x19].extrinsic | uVar12;
    if (on == '\0') {
      u.uprops[0x19].extrinsic = uVar5;
    }
    see_monsters();
  }
  if (!bVar16) {
    if (on == '\0') {
      u.uprops[0x13].extrinsic = ~uVar12 & u.uprops[0x13].extrinsic;
      if (((side_effects != '\0') && (u.uprops[0x13].extrinsic == 0)) &&
         ((u.uprops[0x13].intrinsic == 0 &&
          ((u.uprops[0x13].blocked == 0 &&
           (pline("You sure are noisy."), (otmp->oprops & 0x4000) != 0)))))) {
        pbVar1 = (byte *)((long)&otmp->oprops_known + 1);
        *pbVar1 = *pbVar1 | 0x40;
      }
    }
    else {
      if ((((side_effects != '\0') && (u.uprops[0x13].extrinsic == 0)) &&
          (u.uprops[0x13].intrinsic == 0)) &&
         ((u.uprops[0x13].blocked == 0 &&
          (pline("You move very quietly."), (otmp->oprops & 0x4000) != 0)))) {
        pbVar1 = (byte *)((long)&otmp->oprops_known + 1);
        *pbVar1 = *pbVar1 | 0x40;
      }
      u.uprops[0x13].extrinsic = u.uprops[0x13].extrinsic | uVar12;
    }
  }
  if (!bVar18) {
    if (on == '\0') {
      u.uprops[0x25].extrinsic = u.uprops[0x25].extrinsic & ~uVar12;
      if (u.uprops[0x25].extrinsic == 0) {
        u.uprops[0x25].extrinsic = 0;
        u.uprops[0x25].intrinsic = 0;
      }
    }
    else {
      if ((u.uprops[0x25].extrinsic == 0) && (u.uprops[0x25].intrinsic < 0x1000000)) {
        uVar5 = mt_random();
        incr_itimeout(&u.uprops[0x25].intrinsic,(ulong)(uVar5 % 0x14 + 1));
      }
      u.uprops[0x25].extrinsic = u.uprops[0x25].extrinsic | uVar12;
    }
  }
  if (!bVar17) {
    uVar5 = u.uprops[0x28].extrinsic | uVar12;
    u.uprops[0x28].extrinsic = ~uVar12 & u.uprops[0x28].extrinsic;
    if (on != '\0') {
      u.uprops[0x28].extrinsic = uVar5;
    }
  }
  if (!bVar15) {
    uVar5 = u.uprops[0x14].extrinsic | uVar12;
    u.uprops[0x14].extrinsic = ~uVar12 & u.uprops[0x14].extrinsic;
    if (on != '\0') {
      u.uprops[0x14].extrinsic = uVar5;
    }
  }
  if ((uVar6 >> 0xd & 1) != 0) {
    uVar5 = u.uprops[0x2d].extrinsic | uVar12;
    u.uprops[0x2d].extrinsic = ~uVar12 & u.uprops[0x2d].extrinsic;
    if (on != '\0') {
      u.uprops[0x2d].extrinsic = uVar5;
    }
  }
  if ((uVar6 >> 0xe & 1) != 0) {
    uVar5 = u.uprops[10].extrinsic | uVar12;
    u.uprops[10].extrinsic = ~uVar12 & u.uprops[10].extrinsic;
    if (on != '\0') {
      u.uprops[10].extrinsic = uVar5;
    }
  }
  if ((uVar6 >> 0x12 & 1) != 0) {
    uVar5 = u.uprops[0xf].extrinsic | uVar12;
    u.uprops[0xf].extrinsic = ~uVar12 & u.uprops[0xf].extrinsic;
    if (on != '\0') {
      u.uprops[0xf].extrinsic = uVar5;
    }
  }
  if ((uVar10 & 0x20) != 0) {
    if ((otmp == (obj *)0x0) || ((long)otmp->oartifact == 0)) {
      paVar7 = (artifact *)0x0;
    }
    else {
      paVar7 = artilist + otmp->oartifact;
    }
    if ((paVar7 == (artifact *)0x0) || (paVar7->mtype == 0)) {
      if (on == '\0') {
        u.uprops[0x18].extrinsic = u.uprops[0x18].extrinsic & ~uVar12;
      }
      else {
        u.uprops[0x18].extrinsic = u.uprops[0x18].extrinsic | uVar12;
      }
    }
    else if (on == '\0') {
      u.uprops[0x41].extrinsic = u.uprops[0x41].extrinsic & ~uVar12;
      if ((otmp == (obj *)0x0) || ((long)otmp->oartifact == 0)) {
        paVar7 = (artifact *)0x0;
      }
      else {
        paVar7 = artilist + otmp->oartifact;
      }
      if (paVar7 == (artifact *)0x0) {
        uVar5 = 0xffffffff;
      }
      else {
        uVar5 = ~(uint)paVar7->mtype;
      }
      flags.warntype = flags.warntype & uVar5;
    }
    else {
      u.uprops[0x41].extrinsic = u.uprops[0x41].extrinsic | uVar12;
      uVar5 = 0;
      if ((otmp == (obj *)0x0) || ((long)otmp->oartifact == 0)) {
        paVar7 = (artifact *)0x0;
      }
      else {
        paVar7 = artilist + otmp->oartifact;
      }
      if (paVar7 != (artifact *)0x0) {
        uVar5 = (uint)paVar7->mtype;
      }
      flags.warntype = flags.warntype | uVar5;
    }
    see_monsters();
  }
  if ((uVar6 >> 0x1b & 1) != 0) {
    if (paVar8->mtype == 0) {
      if (on == '\0') {
        u.uprops[0x18].extrinsic = u.uprops[0x18].extrinsic & ~uVar12;
      }
      else {
        u.uprops[0x18].extrinsic = u.uprops[0x18].extrinsic | uVar12;
      }
    }
    else if (on == '\0') {
      u.uprops[0x41].extrinsic = u.uprops[0x41].extrinsic & ~uVar12;
    }
    else {
      u.uprops[0x41].extrinsic = u.uprops[0x41].extrinsic | uVar12;
    }
    see_monsters();
  }
  if ((short)uVar10 < 0) {
    uVar5 = u.uprops[0x30].extrinsic | uVar12;
    u.uprops[0x30].extrinsic = ~uVar12 & u.uprops[0x30].extrinsic;
    if (on != '\0') {
      u.uprops[0x30].extrinsic = uVar5;
    }
  }
  if ((uVar6 >> 0x10 & 1) != 0) {
    uVar5 = u.uprops[0x32].extrinsic | uVar12;
    u.uprops[0x32].extrinsic = ~uVar12 & u.uprops[0x32].extrinsic;
    if (on != '\0') {
      u.uprops[0x32].extrinsic = uVar5;
    }
  }
  if ((uVar6 >> 0x11 & 1) != 0) {
    uVar5 = u.uprops[0x33].extrinsic | uVar12;
    u.uprops[0x33].extrinsic = ~uVar12 & u.uprops[0x33].extrinsic;
    if (on != '\0') {
      u.uprops[0x33].extrinsic = uVar5;
    }
  }
  if ((uVar6 >> 0x19 & 1) != 0) {
    u.xray_range = -(uint)(on == '\0') | 3;
    vision_full_recalc = '\x01';
  }
  if (((wp_mask & 0x500U) != 0) && ((uVar10 & 0x4000000) != 0)) {
    uVar6 = u.uprops[0x2a].extrinsic | uVar12;
    u.uprops[0x2a].extrinsic = ~uVar12 & u.uprops[0x2a].extrinsic;
    if (on != '\0') {
      u.uprops[0x2a].extrinsic = uVar6;
    }
  }
  if ((((on == '\0') && (wp_mask == 0x1000)) && (paVar8 != (artifact *)0x0)) &&
     (((byte)(paVar8->inv_prop - 1) < 0x42 && ((u.uprops[paVar8->inv_prop].extrinsic & 0x2000) != 0)
      ))) {
    arti_invoke(otmp);
    return;
  }
  return;
}

Assistant:

void set_artifact_intrinsic(struct obj *otmp, boolean on, long wp_mask,
			    boolean side_effects)
{
	unsigned int *mask = 0;
	const struct artifact *oart = get_artifact(otmp);
	uchar dtyp;
	long spfx;
	boolean spfx_stlth = FALSE;	/* we ran out of SPFX_* bits, so... */
	boolean spfx_fumbling = FALSE;
	boolean spfx_hunger = FALSE;
	boolean spfx_aggravate = FALSE;

	if (!oart && !otmp->oprops)
	    return;

	/* effects from the defn field */
	if (oart)
	    dtyp = (wp_mask != W_ART) ? oart->defn.adtyp : oart->cary.adtyp;
	else
	    dtyp = 0;

	if (dtyp == AD_FIRE)
	    mask = &EFire_resistance;
	else if (dtyp == AD_COLD)
	    mask = &ECold_resistance;
	else if (dtyp == AD_ELEC)
	    mask = &EShock_resistance;
	else if (dtyp == AD_MAGM)
	    mask = &EAntimagic;
	else if (dtyp == AD_DISN)
	    mask = &EDisint_resistance;
	else if (dtyp == AD_DRST)
	    mask = &EPoison_resistance;

	if (mask && wp_mask == W_ART && !on) {
	    /* find out if some other artifact also confers this intrinsic */
	    /* if so, leave the mask alone */
	    struct obj* obj;
	    for (obj = invent; obj; obj = obj->nobj)
		if (obj != otmp && obj->oartifact) {
		    const struct artifact *art = get_artifact(obj);
		    if (art->cary.adtyp == dtyp ||
			(dtyp == AD_MAGM && is_quest_artifact(obj))) {
			mask = NULL;
			break;
		    }
		}
	}
	if (mask) {
	    if (on) *mask |= wp_mask;
	    else *mask &= ~wp_mask;
	}

	/* quest artifact grants magic resistance when carried by their role */
	if (is_quest_artifact(otmp) && wp_mask == W_ART) {
	    if (on) {
		EAntimagic |= W_ART;
	    } else {
		/* don't take away magic resistance if another artifact grants it */
		struct obj *obj;
		for (obj = invent; obj; obj = obj->nobj) {
		    if (obj != otmp && obj->oartifact) {
			const struct artifact *art = get_artifact(obj);
			if (art->cary.adtyp == AD_MAGM) break;
		    }
		}
		if (!obj) EAntimagic &= ~W_ART;
	    }
	}

	/* intrinsics from the spfx field; there could be more than one */
	spfx = 0;
	if (oart) {
	    spfx = (wp_mask != W_ART) ? oart->spfx : oart->cspfx;
	} else if ((wp_mask == W_WEP ||
		    (wp_mask == W_SWAPWEP && (u.twoweap || !on))) &&
		   (otmp->oclass == WEAPON_CLASS || is_weptool(otmp)) &&
		   !is_ammo(otmp) && !is_missile(otmp)) {
	    if (otmp->oprops & ITEM_REFLECTION)
		spfx |= SPFX_REFLECT;
	    if (otmp->oprops & ITEM_ESP)
		spfx |= SPFX_ESP;
	    if (otmp->oprops & ITEM_SEARCHING)
		spfx |= SPFX_SEARCH;
	    if (otmp->oprops & ITEM_WARNING)
		spfx |= SPFX_WARN;
	    if (otmp->oprops & ITEM_STEALTH)
		spfx_stlth = TRUE;
	    if (otmp->oprops & ITEM_FUMBLING)
		spfx_fumbling = TRUE;
	    if (otmp->oprops & ITEM_HUNGER)
		spfx_hunger = TRUE;
	    if (otmp->oprops & ITEM_AGGRAVATE)
		spfx_aggravate = TRUE;
	}

	if (spfx && wp_mask == W_ART && !on) {
	    /* don't change any spfx also conferred by other artifacts */
	    struct obj* obj;
	    for (obj = invent; obj; obj = obj->nobj)
		if (obj != otmp && obj->oartifact) {
		    const struct artifact *art = get_artifact(obj);
		    spfx &= ~art->cspfx;
		}
	}

	if (spfx & SPFX_SEARCH) {
	    if (on) ESearching |= wp_mask;
	    else ESearching &= ~wp_mask;
	}
	if (spfx & SPFX_HALRES) {
	    /* make_hallucinated must (re)set the mask itself to get
	     * the display right */
	    /* hide message when restoring a game */
	    make_hallucinated((long)!on, side_effects, wp_mask);
	}
	if (spfx & SPFX_ESP) {
	    if (on) ETelepat |= wp_mask;
	    else ETelepat &= ~wp_mask;
	    see_monsters();
	}
	if (spfx_stlth) {
	    if (on) {
		if (side_effects && !EStealth && !HStealth && !BStealth) {
		    pline("You move very quietly.");
		    if (otmp->oprops & ITEM_STEALTH)
			otmp->oprops_known |= ITEM_STEALTH;
		}
		EStealth |= wp_mask;
	    } else {
		EStealth &= ~wp_mask;
		if (side_effects && !EStealth && !HStealth && !BStealth) {
		    pline("You sure are noisy.");
		    if (otmp->oprops & ITEM_STEALTH)
			otmp->oprops_known |= ITEM_STEALTH;
		}
	    }
	}
	if (spfx_fumbling) {
	    if (on) {
		if (!EFumbling && !(HFumbling & ~TIMEOUT))
		    incr_itimeout(&HFumbling, rnd(20));
		EFumbling |= wp_mask;
	    } else {
		EFumbling &= ~wp_mask;
		if (!EFumbling && ~(HFumbling & ~TIMEOUT))
		    HFumbling = EFumbling = 0;
	    }
	}
	if (spfx_hunger) {
	    if (on) EHunger |= wp_mask;
	    else EHunger &= ~wp_mask;
	}
	if (spfx_aggravate) {
	    if (on) EAggravate_monster |= wp_mask;
	    else EAggravate_monster &= ~wp_mask;
	}
	if (spfx & SPFX_DISPL) {
	    if (on) EDisplaced |= wp_mask;
	    else EDisplaced &= ~wp_mask;
	}
	if (spfx & SPFX_REGEN) {
	    if (on) ERegeneration |= wp_mask;
	    else ERegeneration &= ~wp_mask;
	}
	if (spfx & SPFX_TCTRL) {
	    if (on) ETeleport_control |= wp_mask;
	    else ETeleport_control &= ~wp_mask;
	}
	if (spfx & SPFX_WARN) {
	    if (spec_m2(otmp)) {
		if (on) {
			EWarn_of_mon |= wp_mask;
			flags.warntype |= spec_m2(otmp);
		} else {
			EWarn_of_mon &= ~wp_mask;
			flags.warntype &= ~spec_m2(otmp);
		}
	    } else {
		if (on) EWarning |= wp_mask;
		else EWarning &= ~wp_mask;
	    }
	    see_monsters();
	}
	if (spfx & SPFX_WARN_S) {
	    if (oart->mtype) {
		if (on) {
		    EWarn_of_mon |= wp_mask;
		} else {
		    EWarn_of_mon &= ~wp_mask;
		}
	    } else {
		if (on) EWarning |= wp_mask;
	    	else EWarning &= ~wp_mask;
	    }
	    see_monsters();
	}
	if (spfx & SPFX_EREGEN) {
	    if (on) EEnergy_regeneration |= wp_mask;
	    else EEnergy_regeneration &= ~wp_mask;
	}
	if (spfx & SPFX_HSPDAM) {
	    if (on) EHalf_spell_damage |= wp_mask;
	    else EHalf_spell_damage &= ~wp_mask;
	}
	if (spfx & SPFX_HPHDAM) {
	    if (on) EHalf_physical_damage |= wp_mask;
	    else EHalf_physical_damage &= ~wp_mask;
	}
	if (spfx & SPFX_XRAY) {
	    /* this assumes that no one else is using xray_range */
	    if (on) u.xray_range = 3;
	    else u.xray_range = -1;
	    vision_full_recalc = 1;
	}
	if ((spfx & SPFX_REFLECT) && (wp_mask & (W_WEP|W_SWAPWEP))) {
	    if (on) EReflecting |= wp_mask;
	    else EReflecting &= ~wp_mask;
	}

	if (wp_mask == W_ART && !on && oart && oart->inv_prop) {
	    /* might have to turn off invoked power too */
	    if (oart->inv_prop <= LAST_PROP &&
		(u.uprops[oart->inv_prop].extrinsic & W_ARTI))
		arti_invoke(otmp);
	}
}